

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# word2vec.c
# Opt level: O3

void ReadWord(char *word,FILE *fin)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  
  iVar1 = feof((FILE *)fin);
  uVar3 = 0;
  if (iVar1 == 0) {
    uVar3 = 0;
    do {
      uVar2 = fgetc((FILE *)fin);
      if (uVar2 != 0xd) {
        if ((uVar2 < 0x21) && ((0x100000600U >> ((ulong)uVar2 & 0x3f) & 1) != 0)) {
          if (uVar3 != 0) {
            if (uVar2 == 10) {
              ungetc(10,(FILE *)fin);
            }
            break;
          }
          if (uVar2 == 10) {
            builtin_strncpy(word,"</s>",5);
            return;
          }
        }
        else {
          word[uVar3] = (char)uVar2;
          uVar3 = uVar3 + (uVar3 < 0x62);
        }
      }
      iVar1 = feof((FILE *)fin);
    } while (iVar1 == 0);
  }
  word[(int)uVar3] = '\0';
  return;
}

Assistant:

void ReadWord(char *word, FILE *fin) {
  int a = 0, ch;
  while (!feof(fin)) {
    ch = fgetc(fin);
    if (ch == 13) continue;
    if ((ch == ' ') || (ch == '\t') || (ch == '\n')) {
      if (a > 0) {
        if (ch == '\n') ungetc(ch, fin);
        break;
      }
      if (ch == '\n') {
        strcpy(word, (char *)"</s>");
        return;
      } else continue;
    }
    word[a] = ch;
    a++;
    if (a >= MAX_STRING - 1) a--;   // Truncate too long words
  }
  word[a] = 0;
}